

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void AMPLSAddMessage(AMPLS_MP_Solver *slv,char *msg)

{
  void *pvVar1;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pvVar1 = slv->internal_info_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,msg,&local_31);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             ((long)pvVar1 + 0x38),&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void AMPLSAddMessage(AMPLS_MP_Solver* slv, const char* msg) {
  assert(slv->internal_info_);
  assert(msg);
  ((AMPLS_MP__internal*)(slv->internal_info_))->msg_extra_.
      push_back(msg);
}